

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

ar_object ar_init(int method,int N)

{
  uint a;
  ar_object paVar1;
  double dVar2;
  
  if (0 < N) {
    dVar2 = log((double)N);
    a = imin(N + -1,(int)(dVar2 * 10.0));
    if (method == 2) {
      a = imin(a,0xc);
    }
    paVar1 = (ar_object)malloc((long)(int)(a + N) * 8 + 0x48);
    paVar1->ordermax = a;
    paVar1->order = a;
    paVar1->p = a;
    paVar1->N = N;
    paVar1->retval = 0;
    paVar1->method = method;
    if (0 < (int)a) {
      memset(paVar1 + 1,0,(ulong)a << 3);
    }
    paVar1->phi = (double *)(paVar1 + 1);
    paVar1->res = (double *)(&paVar1[1].N + (long)(int)a * 2);
    paVar1->optmethod = 5;
    paVar1->mean = 0.0;
    paVar1->var = 1.0;
    return paVar1;
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

ar_object ar_init(int method, int N) {
	ar_object obj = NULL;
	int i, ordermax,logn,p;


	if (N <= 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}
	//retval = 0 Input Error
	// retval = 1 Probable Success
	// retval = 4 Optimization Routine didn't converge
	// Retval = 15 Optimization Routine Encountered Inf/Nan Values

	logn = (int) (10.0 * log((double)N));
	ordermax = imin(N - 1, logn);

	if (method == 2) {
		ordermax = imin(ordermax, 12); // MLE
	}

	p = ordermax;

	obj = (ar_object)malloc(sizeof(struct ar_set) + sizeof(double)* (p + N));

	obj->p = obj->order = obj->ordermax = p;
	obj->N = N;
	obj->retval = 0;
	obj->method = method;

	for (i = 0; i < p; ++i) {
		obj->params[i] = 0.0;
	}
	obj->phi = &obj->params[0];
	obj->res = &obj->params[p];

	obj->optmethod = 5;// Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;

	return obj;
}